

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

fio_protocol_s *
fio_cluster_protocol_alloc
          (intptr_t uuid,_func_void_cluster_pr_s_ptr *handler,_func_void_void_ptr_intptr_t *sender)

{
  long lVar1;
  undefined8 *__addr;
  void *__addr_00;
  int *piVar2;
  size_t __len;
  undefined8 *puVar3;
  ulong __len_00;
  fio_protocol_s *pfVar4;
  
  puVar3 = (undefined8 *)0x0;
  __addr = (undefined8 *)mmap(sys_alloc_next_alloc,0x5000,3,0x22,-1,0);
  if (__addr != (undefined8 *)0xffffffffffffffff) {
    puVar3 = __addr;
    if (((ulong)__addr & 0x7fff) != 0) {
      munmap(__addr,0x5000);
      puVar3 = (undefined8 *)0x0;
      __addr_00 = mmap((void *)0x0,0xd000,3,0x22,-1,0);
      if (__addr_00 == (void *)0xffffffffffffffff) goto LAB_0013cae7;
      __len_00 = (ulong)((uint)__addr_00 & 0x7fff);
      lVar1 = -__len_00;
      __len = lVar1 + 0x8000;
      munmap(__addr_00,__len);
      puVar3 = (undefined8 *)(__len + (long)__addr_00);
      munmap((void *)((long)__addr_00 + lVar1 + 0xd000),__len_00);
    }
    sys_alloc_next_alloc = puVar3 + 0x8000000;
  }
LAB_0013cae7:
  if (puVar3 == (undefined8 *)0x0) {
    pfVar4 = (fio_protocol_s *)0x0;
  }
  else {
    *puVar3 = 0x5000;
    pfVar4 = (fio_protocol_s *)(puVar3 + 2);
  }
  if (pfVar4 != (fio_protocol_s *)0x0) {
    pfVar4->on_data = fio_cluster_on_data;
    pfVar4->on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4->on_shutdown = fio_cluster_on_shutdown;
    pfVar4->on_close = fio_cluster_on_close;
    pfVar4->ping = fio_cluster_ping;
    pfVar4->rsv = 0;
    pfVar4[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)uuid;
    pfVar4[1].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)handler;
    pfVar4[1].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)sender;
    pfVar4[1].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[1].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[1].rsv = 0;
    pfVar4[2].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[2].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[2].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[2].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[2].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[2].rsv = 0;
    pfVar4[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar4[3].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    *(undefined1 *)((long)&pfVar4[4].on_data + 4) = 0;
    return pfVar4;
  }
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: Cluster protocol allocation failed.");
  }
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static inline fio_protocol_s *
fio_cluster_protocol_alloc(intptr_t uuid,
                           void (*handler)(struct cluster_pr_s *pr),
                           void (*sender)(void *data, intptr_t auuid)) {
  cluster_pr_s *p = fio_mmap(sizeof(*p));
  if (!p) {
    FIO_LOG_FATAL("Cluster protocol allocation failed.");
    exit(errno);
  }
  p->protocol = (fio_protocol_s){
      .ping = fio_cluster_ping,
      .on_close = fio_cluster_on_close,
      .on_shutdown = fio_cluster_on_shutdown,
      .on_data = fio_cluster_on_data,
  };
  p->uuid = uuid;
  p->handler = handler;
  p->sender = sender;
  p->pubsub = (fio_sub_hash_s)FIO_SET_INIT;
  p->patterns = (fio_sub_hash_s)FIO_SET_INIT;
  p->lock = FIO_LOCK_INIT;
  return &p->protocol;
}